

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int scale_image_RGB_to_NTSC_safe(uchar *orig,int width,int height,int channels)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uchar auStack_108 [264];
  
  iVar17 = 0;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0 < channels)) {
    uVar34 = 0xc;
    uVar35 = 0xd;
    uVar36 = 0xe;
    uVar37 = 0xf;
    uVar22 = 8;
    uVar23 = 9;
    uVar24 = 10;
    uVar25 = 0xb;
    uVar26 = 4;
    uVar27 = 5;
    uVar28 = 6;
    uVar29 = 7;
    uVar30 = 0;
    uVar31 = 1;
    uVar32 = 2;
    uVar33 = 3;
    lVar18 = 0;
    do {
      auVar39._0_4_ =
           (((float)(uVar26 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar26 & 0xffff | 0x4b000000)) * 219.99799;
      auVar39._4_4_ =
           (((float)(uVar27 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar27 & 0xffff | 0x4b000000)) * 219.99799;
      auVar39._8_4_ =
           (((float)(uVar28 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar28 & 0xffff | 0x4b000000)) * 219.99799;
      auVar39._12_4_ =
           (((float)(uVar29 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar29 & 0xffff | 0x4b000000)) * 219.99799;
      auVar38._0_4_ =
           (((float)(uVar30 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar30 & 0xffff | 0x4b000000)) * 219.99799;
      auVar38._4_4_ =
           (((float)(uVar31 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar31 & 0xffff | 0x4b000000)) * 219.99799;
      auVar38._8_4_ =
           (((float)(uVar32 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar32 & 0xffff | 0x4b000000)) * 219.99799;
      auVar38._12_4_ =
           (((float)(uVar33 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar33 & 0xffff | 0x4b000000)) * 219.99799;
      auVar38 = divps(auVar38,_DAT_00191680);
      auVar40 = divps(auVar39,_DAT_00191680);
      auVar21._0_4_ = (int)(auVar38._0_4_ + 15.501);
      auVar21._4_4_ = (int)(auVar38._4_4_ + 15.501);
      auVar21._8_4_ = (int)(auVar38._8_4_ + 15.501);
      auVar21._12_4_ = (int)(auVar38._12_4_ + 15.501);
      auVar44._0_4_ = (int)(auVar40._0_4_ + 15.501);
      auVar44._4_4_ = (int)(auVar40._4_4_ + 15.501);
      auVar44._8_4_ = (int)(auVar40._8_4_ + 15.501);
      auVar44._12_4_ = (int)(auVar40._12_4_ + 15.501);
      auVar21 = packssdw(auVar21,auVar44);
      auVar43._0_4_ =
           (((float)(uVar34 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar34 & 0xffff | 0x4b000000)) * 219.99799;
      auVar43._4_4_ =
           (((float)(uVar35 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar35 & 0xffff | 0x4b000000)) * 219.99799;
      auVar43._8_4_ =
           (((float)(uVar36 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar36 & 0xffff | 0x4b000000)) * 219.99799;
      auVar43._12_4_ =
           (((float)(uVar37 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar37 & 0xffff | 0x4b000000)) * 219.99799;
      auVar42._0_4_ =
           (((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar22 & 0xffff | 0x4b000000)) * 219.99799;
      auVar42._4_4_ =
           (((float)(uVar23 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar23 & 0xffff | 0x4b000000)) * 219.99799;
      auVar42._8_4_ =
           (((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar24 & 0xffff | 0x4b000000)) * 219.99799;
      auVar42._12_4_ =
           (((float)(uVar25 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar25 & 0xffff | 0x4b000000)) * 219.99799;
      auVar38 = divps(auVar42,_DAT_00191680);
      auVar44 = divps(auVar43,_DAT_00191680);
      auVar40._0_4_ = (int)(auVar38._0_4_ + 15.501);
      auVar40._4_4_ = (int)(auVar38._4_4_ + 15.501);
      auVar40._8_4_ = (int)(auVar38._8_4_ + 15.501);
      auVar40._12_4_ = (int)(auVar38._12_4_ + 15.501);
      auVar41._0_4_ = (int)(auVar44._0_4_ + 15.501);
      auVar41._4_4_ = (int)(auVar44._4_4_ + 15.501);
      auVar41._8_4_ = (int)(auVar44._8_4_ + 15.501);
      auVar41._12_4_ = (int)(auVar44._12_4_ + 15.501);
      auVar38 = packssdw(auVar40,auVar41);
      sVar1 = auVar21._0_2_;
      sVar2 = auVar21._2_2_;
      sVar3 = auVar21._4_2_;
      sVar4 = auVar21._6_2_;
      sVar5 = auVar21._8_2_;
      sVar6 = auVar21._10_2_;
      sVar7 = auVar21._12_2_;
      sVar8 = auVar21._14_2_;
      sVar9 = auVar38._0_2_;
      sVar10 = auVar38._2_2_;
      sVar11 = auVar38._4_2_;
      sVar12 = auVar38._6_2_;
      sVar13 = auVar38._8_2_;
      sVar14 = auVar38._10_2_;
      sVar15 = auVar38._12_2_;
      sVar16 = auVar38._14_2_;
      auStack_108[lVar18] = (0 < sVar1) * (sVar1 < 0x100) * auVar21[0] - (0xff < sVar1);
      auStack_108[lVar18 + 1] = (0 < sVar2) * (sVar2 < 0x100) * auVar21[2] - (0xff < sVar2);
      auStack_108[lVar18 + 2] = (0 < sVar3) * (sVar3 < 0x100) * auVar21[4] - (0xff < sVar3);
      auStack_108[lVar18 + 3] = (0 < sVar4) * (sVar4 < 0x100) * auVar21[6] - (0xff < sVar4);
      auStack_108[lVar18 + 4] = (0 < sVar5) * (sVar5 < 0x100) * auVar21[8] - (0xff < sVar5);
      auStack_108[lVar18 + 5] = (0 < sVar6) * (sVar6 < 0x100) * auVar21[10] - (0xff < sVar6);
      auStack_108[lVar18 + 6] = (0 < sVar7) * (sVar7 < 0x100) * auVar21[0xc] - (0xff < sVar7);
      auStack_108[lVar18 + 7] = (0 < sVar8) * (sVar8 < 0x100) * auVar21[0xe] - (0xff < sVar8);
      auStack_108[lVar18 + 8] = (0 < sVar9) * (sVar9 < 0x100) * auVar38[0] - (0xff < sVar9);
      auStack_108[lVar18 + 9] = (0 < sVar10) * (sVar10 < 0x100) * auVar38[2] - (0xff < sVar10);
      auStack_108[lVar18 + 10] = (0 < sVar11) * (sVar11 < 0x100) * auVar38[4] - (0xff < sVar11);
      auStack_108[lVar18 + 0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar38[6] - (0xff < sVar12);
      auStack_108[lVar18 + 0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar38[8] - (0xff < sVar13);
      auStack_108[lVar18 + 0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar38[10] - (0xff < sVar14);
      auStack_108[lVar18 + 0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar38[0xc] - (0xff < sVar15);
      auStack_108[lVar18 + 0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar38[0xe] - (0xff < sVar16);
      lVar18 = lVar18 + 0x10;
      uVar30 = uVar30 + 0x10;
      uVar31 = uVar31 + 0x10;
      uVar32 = uVar32 + 0x10;
      uVar33 = uVar33 + 0x10;
      uVar26 = uVar26 + 0x10;
      uVar27 = uVar27 + 0x10;
      uVar28 = uVar28 + 0x10;
      uVar29 = uVar29 + 0x10;
      uVar22 = uVar22 + 0x10;
      uVar23 = uVar23 + 0x10;
      uVar24 = uVar24 + 0x10;
      uVar25 = uVar25 + 0x10;
      uVar34 = uVar34 + 0x10;
      uVar35 = uVar35 + 0x10;
      uVar36 = uVar36 + 0x10;
      uVar37 = uVar37 + 0x10;
    } while (lVar18 != 0x100);
    iVar19 = height * width * channels;
    iVar17 = 1;
    if (0 < iVar19) {
      uVar22 = channels - (~channels & 1U);
      lVar18 = 0;
      do {
        if (0 < (int)uVar22) {
          uVar20 = 0;
          do {
            orig[uVar20] = auStack_108[orig[uVar20]];
            uVar20 = uVar20 + 1;
          } while (uVar22 != uVar20);
        }
        lVar18 = lVar18 + (ulong)(uint)channels;
        orig = orig + (uint)channels;
      } while ((int)lVar18 < iVar19);
    }
  }
  return iVar17;
}

Assistant:

int
	scale_image_RGB_to_NTSC_safe
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	const float scale_lo = 16.0f - 0.499f;
	const float scale_hi = 235.0f + 0.499f;
	int i, j;
	int nc = channels;
	unsigned char scale_LUT[256];
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) )
	{
		/*	nothing to do	*/
		return 0;
	}
	/*	set up the scaling Look Up Table	*/
	for( i = 0; i < 256; ++i )
	{
		scale_LUT[i] = (unsigned char)((scale_hi - scale_lo) * i / 255.0f + scale_lo);
	}
	/*	for channels = 2 or 4, ignore the alpha component	*/
	nc -= 1 - (channels & 1);
	/*	OK, go through the image and scale any non-alpha components	*/
	for( i = 0; i < width*height*channels; i += channels )
	{
		for( j = 0; j < nc; ++j )
		{
			orig[i+j] = scale_LUT[orig[i+j]];
		}
	}
	return 1;
}